

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_v2.cpp
# Opt level: O0

MPP_RET mpp_enc_start_async(MppEnc ctx)

{
  uint uVar1;
  char *pcVar2;
  MppThread *this;
  char local_28 [8];
  char name [16];
  MppEncImpl *enc;
  MppEnc ctx_local;
  
  name._8_8_ = ctx;
  if ((mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","%p in\n","mpp_enc_start_async",ctx);
  }
  pcVar2 = strof_coding_type(*(MppCodingType *)name._8_8_);
  uVar1 = getpid();
  snprintf(local_28,0xf,"mpp_%se_%d",pcVar2,(ulong)uVar1);
  this = (MppThread *)operator_new(0x198);
  MppThread::MppThread(this,mpp_enc_async_thread,*(void **)(name._8_8_ + 0x70),local_28);
  *(MppThread **)(name._8_8_ + 0x68) = this;
  MppThread::start(*(MppThread **)(name._8_8_ + 0x68));
  if ((mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","%p out\n","mpp_enc_start_async",name._8_8_);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_start_async(MppEnc ctx)
{
    MppEncImpl *enc = (MppEncImpl *)ctx;
    char name[16];

    enc_dbg_func("%p in\n", enc);

    snprintf(name, sizeof(name) - 1, "mpp_%se_%d",
             strof_coding_type(enc->coding), getpid());

    enc->thread_enc = new MppThread(mpp_enc_async_thread, enc->mpp, name);
    enc->thread_enc->start();

    enc_dbg_func("%p out\n", enc);

    return MPP_OK;
}